

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O0

void __thiscall
print_fileinfo::print_fileinfo(print_fileinfo *this,string *filesystemname,string *romname)

{
  string *romname_local;
  string *filesystemname_local;
  print_fileinfo *this_local;
  
  action::action(&this->super_action);
  (this->super_action)._vptr_action = (_func_int **)&PTR__print_fileinfo_0019c848;
  std::__cxx11::string::string((string *)&this->_fsname,(string *)filesystemname);
  std::__cxx11::string::string((string *)&this->_romname,(string *)romname);
  return;
}

Assistant:

print_fileinfo(const std::string& filesystemname, const std::string&romname)
        : _fsname(filesystemname), _romname(romname)
    {
    }